

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  ImFont *font_local;
  
  pIVar1 = GImGui;
  g = (ImGuiContext *)font;
  if (font == (ImFont *)0x0) {
    g = (ImGuiContext *)GetDefaultFont();
  }
  SetCurrentFont((ImFont *)g);
  ImVector<ImFont_*>::push_back(&pIVar1->FontStack,(ImFont **)&g);
  ImDrawList::PushTextureID
            (pIVar1->CurrentWindow->DrawList,*(ImTextureID *)(*(long *)((g->IO).KeyMap + 3) + 8));
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}